

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O2

void __thiscall
NamespaceData::NamespaceData
          (NamespaceData *this,Allocator *allocator,SynBase *source,ScopeData *scope,
          NamespaceData *parent,SynIdentifier *name,uint uniqueId)

{
  Lexeme *pLVar1;
  Lexeme *pLVar2;
  char *pcVar3;
  char *pcVar4;
  SynBase *pSVar5;
  undefined4 uVar6;
  bool bVar7;
  uint uVar8;
  
  this->source = source;
  this->scope = scope;
  this->parent = parent;
  (this->children).allocator = allocator;
  (this->children).data = (this->children).little;
  (this->children).count = 0;
  (this->children).max = 2;
  (this->name).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002222e8;
  uVar6 = *(undefined4 *)&(name->super_SynBase).field_0xc;
  pLVar1 = (name->super_SynBase).begin;
  pLVar2 = (name->super_SynBase).end;
  pcVar3 = (name->super_SynBase).pos.begin;
  pcVar4 = (name->super_SynBase).pos.end;
  pSVar5 = (name->super_SynBase).next;
  (this->name).super_SynBase.typeID = (name->super_SynBase).typeID;
  *(undefined4 *)&(this->name).super_SynBase.field_0xc = uVar6;
  (this->name).super_SynBase.begin = pLVar1;
  (this->name).super_SynBase.end = pLVar2;
  (this->name).super_SynBase.pos.begin = pcVar3;
  (this->name).super_SynBase.pos.end = pcVar4;
  (this->name).super_SynBase.next = pSVar5;
  bVar7 = (name->super_SynBase).isInternal;
  (this->name).super_SynBase.listed = (name->super_SynBase).listed;
  (this->name).super_SynBase.isInternal = bVar7;
  (this->name).super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_002222a0;
  pcVar3 = (name->name).end;
  (this->name).name.begin = (name->name).begin;
  (this->name).name.end = pcVar3;
  this->uniqueId = uniqueId;
  uVar8 = InplaceStr::hash(&name->name);
  this->nameHash = uVar8;
  if (parent != (NamespaceData *)0x0) {
    uVar8 = NULLC::StringHashContinue(parent->fullNameHash,".");
    uVar8 = NULLC::StringHashContinue(uVar8,(name->name).begin,(name->name).end);
  }
  this->fullNameHash = uVar8;
  return;
}

Assistant:

NamespaceData(Allocator *allocator, SynBase *source, ScopeData *scope, NamespaceData *parent, const SynIdentifier& name, unsigned uniqueId): source(source), scope(scope), parent(parent), children(allocator), name(name), uniqueId(uniqueId)
	{
		nameHash = name.name.hash();

		if(parent)
			fullNameHash = NULLC::StringHashContinue(NULLC::StringHashContinue(parent->fullNameHash, "."), name.name.begin, name.name.end);
		else
			fullNameHash = nameHash;
	}